

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantag.cpp
# Opt level: O0

string * YAML::ScanTagSuffix_abi_cxx11_(Stream *INPUT)

{
  undefined1 uVar1;
  RegEx *pRVar2;
  ulong uVar3;
  string *msg_;
  Stream *in_RSI;
  string *in_RDI;
  Mark MVar4;
  int n;
  string *tag;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Stream *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff58;
  allocator local_89;
  string local_88 [32];
  Mark local_68;
  Mark local_58;
  string local_48 [32];
  int local_28;
  undefined1 local_11;
  Stream *local_10;
  int n_00;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  while (uVar1 = Stream::operator_cast_to_bool(in_stack_ffffffffffffff40), (bool)uVar1) {
    pRVar2 = Exp::Tag();
    n_00 = (int)((ulong)pRVar2 >> 0x20);
    local_28 = RegEx::Match((RegEx *)in_stack_ffffffffffffff40,
                            (Stream *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
    ;
    if (local_28 < 1) break;
    Stream::get_abi_cxx11_((Stream *)CONCAT17(uVar1,in_stack_ffffffffffffff58),n_00);
    std::__cxx11::string::operator+=((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    return in_RDI;
  }
  msg_ = (string *)__cxa_allocate_exception(0x40);
  MVar4 = Stream::mark(local_10);
  local_68 = MVar4;
  local_58 = MVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"tag handle with no suffix",&local_89);
  ParserException::ParserException
            (MVar4._0_8_,(Mark *)CONCAT44(MVar4.column,in_stack_ffffffffffffff38),msg_);
  __cxa_throw(msg_,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

const std::string ScanTagSuffix(Stream& INPUT) {
  std::string tag;

  while (INPUT) {
    int n = Exp::Tag().Match(INPUT);
    if (n <= 0)
      break;

    tag += INPUT.get(n);
  }

  if (tag.empty())
    throw ParserException(INPUT.mark(), ErrorMsg::TAG_WITH_NO_SUFFIX);

  return tag;
}